

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_term_compute.cpp
# Opt level: O0

void __thiscall
SourceTermCompute::SourceTermCompute
          (SourceTermCompute *this,vector<double,_std::allocator<double>_> *source_term,
          Elements *elements,InterpolationPoints *elem_interp_pts,Tree *elem_tree,Molecule *molecule
          ,InterpolationPoints *mol_interp_pts,Tree *mol_tree,InteractionList *interaction_list,
          double phys_eps_solute)

{
  _func_int **pp_Var1;
  size_t sVar2;
  vector<double,_std::allocator<double>_> *this_00;
  Tree *in_RCX;
  _func_int **in_RDX;
  Tree *in_RSI;
  TreeCompute *in_RDI;
  Tree *in_R8;
  Tree *in_R9;
  double in_XMM0_Qa;
  __type_conflict _Var3;
  InteractionList *in_stack_00000008;
  Tree *in_stack_00000010;
  InteractionList *in_stack_00000018;
  size_type in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  
  TreeCompute::TreeCompute(in_RDI,in_stack_00000010,in_R8,in_stack_00000018);
  in_RDI->_vptr_TreeCompute = (_func_int **)&PTR_particle_particle_interact_0013cd28;
  in_RDI[1]._vptr_TreeCompute = in_RDX;
  in_RDI[1].source_tree_ = in_RCX;
  in_RDI[1].target_tree_ = in_R9;
  in_RDI[1].interaction_list_ = in_stack_00000008;
  in_RDI[2]._vptr_TreeCompute = (_func_int **)(0.079577471545948 / in_XMM0_Qa);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x121199);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1211ac);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1211c2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1211d8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1211ee);
  pp_Var1 = (_func_int **)Particles::num((Particles *)in_RDI[1]._vptr_TreeCompute);
  in_RDI[7]._vptr_TreeCompute = pp_Var1;
  in_RDI[7].source_tree_ = in_RSI;
  sVar2 = InterpolationPoints::num_interp_pts_per_node
                    ((InterpolationPoints *)in_RDI[1].source_tree_);
  *(int *)&in_RDI[2].source_tree_ = (int)sVar2;
  _Var3 = std::pow<int,int>(0,0x12125d);
  *(int *)((long)&in_RDI[2].source_tree_ + 4) = (int)_Var3;
  sVar2 = Tree::num_nodes(in_RDI->target_tree_);
  in_RDI[2].target_tree_ = (Tree *)(sVar2 * (long)*(int *)((long)&in_RDI[2].source_tree_ + 4));
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(value_type_conflict1 *)0x1212c1);
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(value_type_conflict1 *)0x1212ec);
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(value_type_conflict1 *)0x12131a);
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(value_type_conflict1 *)0x121348);
  sVar2 = InterpolationPoints::num_interp_pts_per_node
                    ((InterpolationPoints *)in_RDI[1].interaction_list_);
  *(int *)&in_RDI[5].interaction_list_ = (int)sVar2;
  _Var3 = std::pow<int,int>(0,0x12137f);
  *(int *)((long)&in_RDI[5].interaction_list_ + 4) = (int)_Var3;
  this_00 = (vector<double,_std::allocator<double>_> *)Tree::num_nodes(in_RDI->source_tree_);
  in_RDI[6]._vptr_TreeCompute =
       (_func_int **)((long)this_00 * (long)*(int *)((long)&in_RDI[5].interaction_list_ + 4));
  std::vector<double,_std::allocator<double>_>::assign
            (this_00,in_stack_ffffffffffffff18,(value_type_conflict1 *)0x1213ec);
  return;
}

Assistant:

SourceTermCompute::SourceTermCompute(std::vector<double>& source_term,
                      class Elements& elements, const class InterpolationPoints& elem_interp_pts,
                      const class Tree& elem_tree,
                      const class Molecule& molecule, const class InterpolationPoints& mol_interp_pts,
                      const class Tree& mol_tree,
                      const class InteractionList& interaction_list, double phys_eps_solute)
    : TreeCompute(mol_tree, elem_tree, interaction_list),
      elements_(elements),  elem_interp_pts_(elem_interp_pts),
      molecule_(molecule),  mol_interp_pts_ (mol_interp_pts),
      one_over_4pi_eps_solute_(constants::ONE_OVER_4PI / phys_eps_solute),
      source_term_(source_term), source_term_offset_(elements_.num())
{
//    timers_.ctor.start();
    
    /* Target clusters */
    
    num_elem_interp_pts_per_node_        = elem_interp_pts_.num_interp_pts_per_node();
    num_elem_interp_potentials_per_node_ = std::pow(num_elem_interp_pts_per_node_, 3);
    num_elem_potentials_                 = target_tree_.num_nodes() * num_elem_interp_potentials_per_node_;
    
    elem_interp_potential_   .assign(num_elem_potentials_, 0.);
    elem_interp_potential_dx_.assign(num_elem_potentials_, 0.);
    elem_interp_potential_dy_.assign(num_elem_potentials_, 0.);
    elem_interp_potential_dz_.assign(num_elem_potentials_, 0.);
    
    
    /* Source clusters */
    
    num_mol_interp_pts_per_node_     = mol_interp_pts_.num_interp_pts_per_node();
    num_mol_interp_charges_per_node_ = std::pow(num_mol_interp_pts_per_node_, 3);
    num_mol_charges_                 = source_tree_.num_nodes() * num_mol_interp_charges_per_node_;
    
    mol_interp_charge_.assign(num_mol_charges_, 0.);
    
//    timers_.ctor.stop();
}